

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

RowGroupPointer * __thiscall
duckdb::RowGroup::Checkpoint
          (RowGroupPointer *__return_storage_ptr__,RowGroup *this,RowGroupWriteData *write_data,
          RowGroupWriter *writer,TableStatistics *global_stats)

{
  int iVar1;
  ColumnStatistics *this_00;
  BaseStatistics *this_01;
  reference other;
  undefined4 extraout_var;
  pointer pCVar2;
  undefined4 extraout_var_00;
  idx_t column_idx;
  ulong i;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  MetaBlockPointer pointer;
  PersistentColumnData persistent_data;
  BinarySerializer serializer;
  undefined1 local_608 [32];
  MetaBlockPointer local_5e8;
  undefined1 local_5d8 [8];
  _Alloc_hider _Stack_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_5c0;
  idx_t iStack_5b0;
  undefined8 local_5a8;
  PersistentColumnData local_5a0;
  BinarySerializer local_560;
  
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->deletes_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data_pointers).
  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  other = (reference)global_stats;
  local_608._8_8_ = writer;
  TableStatistics::GetLock((TableStatistics *)local_608);
  local_608._16_8_ = &__return_storage_ptr__->data_pointers;
  for (i = 0; i < (ulong)((long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->columns).
                                super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                .
                                super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); i = i + 1) {
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                 *)local_608);
    this_00 = TableStatistics::GetStats(global_stats,(TableStatisticsLock *)other,i);
    this_01 = ColumnStatistics::Statistics(this_00);
    other = vector<duckdb::BaseStatistics,_true>::get<true>(&write_data->statistics,i);
    BaseStatistics::Merge(this_01,other);
  }
  __return_storage_ptr__->row_start = (this->super_SegmentBase<duckdb::RowGroup>).start;
  __return_storage_ptr__->tuple_count =
       (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i;
  local_608._24_8_ =
       (write_data->states).
       super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (write_data->states).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_02 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_608._24_8_;
      this_02 = this_02 + 1) {
    iVar1 = (*(*(_func_int ***)local_608._8_8_)[3])();
    local_5e8 = MetadataWriter::GetMetaBlockPointer((MetadataWriter *)CONCAT44(extraout_var,iVar1));
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::push_back
              ((vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *)
               local_608._16_8_,&local_5e8);
    pCVar2 = unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
             ::operator->((unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
                           *)this_02);
    (*pCVar2->_vptr_ColumnCheckpointState[5])(&local_5a0,pCVar2);
    local_5d8[0] = false;
    local_5d8[1] = false;
    local_5d8._2_6_ = 0;
    _Stack_5d0._M_p = (pointer)0x0;
    local_5c8 = 0;
    aStack_5c0._M_allocated_capacity = 0;
    aStack_5c0._8_8_ = 0;
    iStack_5b0 = 0;
    local_5a8._0_1_ = false;
    local_5a8._1_7_ = 0;
    SerializationOptions::SerializationOptions((SerializationOptions *)local_5d8);
    BinarySerializer::BinarySerializer
              (&local_560,(WriteStream *)CONCAT44(extraout_var,iVar1),
               (SerializationOptions *)local_5d8);
    ::std::__cxx11::string::~string((string *)&_Stack_5d0);
    BinarySerializer::OnObjectBegin(&local_560);
    PersistentColumnData::Serialize(&local_5a0,&local_560.super_Serializer);
    BinarySerializer::OnObjectEnd(&local_560);
    BinarySerializer::~BinarySerializer(&local_560);
    PersistentColumnData::~PersistentColumnData(&local_5a0);
  }
  iVar1 = (*(*(_func_int ***)local_608._8_8_)[3])();
  CheckpointDeletes((vector<duckdb::MetaBlockPointer,_true> *)&local_560,this,
                    *(MetadataManager **)(CONCAT44(extraout_var_00,iVar1) + 8));
  ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::_M_move_assign
            (&(__return_storage_ptr__->deletes_pointers).
              super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>,
             &local_560);
  ::std::_Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
  ~_Vector_base((_Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *
                )&local_560);
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_608);
  return __return_storage_ptr__;
}

Assistant:

RowGroupPointer RowGroup::Checkpoint(RowGroupWriteData write_data, RowGroupWriter &writer,
                                     TableStatistics &global_stats) {
	RowGroupPointer row_group_pointer;

	auto lock = global_stats.GetLock();
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		global_stats.GetStats(*lock, column_idx).Statistics().Merge(write_data.statistics[column_idx]);
	}

	// construct the row group pointer and write the column meta data to disk
	D_ASSERT(write_data.states.size() == columns.size());
	row_group_pointer.row_start = start;
	row_group_pointer.tuple_count = count;
	for (auto &state : write_data.states) {
		// get the current position of the table data writer
		auto &data_writer = writer.GetPayloadWriter();
		auto pointer = data_writer.GetMetaBlockPointer();

		// store the stats and the data pointers in the row group pointers
		row_group_pointer.data_pointers.push_back(pointer);

		// Write pointers to the column segments.
		//
		// Just as above, the state can refer to many other states, so this
		// can cascade recursively into more pointer writes.
		auto persistent_data = state->ToPersistentData();
		BinarySerializer serializer(data_writer);
		serializer.Begin();
		persistent_data.Serialize(serializer);
		serializer.End();
	}
	row_group_pointer.deletes_pointers = CheckpointDeletes(writer.GetPayloadWriter().GetManager());
	Verify();
	return row_group_pointer;
}